

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu.c
# Opt level: O0

void mmu_reset(gb_mmu_t *mmu)

{
  gb_mmu_t *mmu_local;
  
  if (mmu != (gb_mmu_t *)0x0) {
    memset(mmu->ram,0,0x2000);
    memset(mmu->hram,0,0x100);
    if (mmu->cart != (gb_cart *)0x0) {
      cart_reset(mmu->cart);
    }
    mmu->bootrom_mapped = true;
    return;
  }
  __assert_fail("mmu != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/mmu.c"
                ,0x3e,"void mmu_reset(gb_mmu_t *)");
}

Assistant:

void mmu_reset(gb_mmu_t *mmu)
{
    assert(mmu != NULL);

    memset(mmu->ram , 0, RAM_SIZE);
    memset(mmu->hram, 0, HRAM_SIZE);

    if (mmu->cart != NULL)
        cart_reset(mmu->cart);

    mmu->bootrom_mapped = true;
}